

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O3

string * __thiscall
vera::getLenticularFragShader_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,size_t _versionNumber)

{
  ulong *puVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  puVar1 = &lenticular_frag_300_abi_cxx11_;
  if (this < (vera *)0x82) {
    puVar1 = &lenticular_frag_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getLenticularFragShader(size_t _versionNumber) {
    std::string rta = "";

    if (_versionNumber < 130)
        rta += lenticular_frag;
    else if (_versionNumber >= 130) 
        rta += lenticular_frag_300;

    return rta;
}